

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# export.cc
# Opt level: O0

string * anon_unknown.dwarf_1785d::getIDLAbsoluteNamespace
                   (string *__return_storage_ptr__,string *type_ns,IDLExport *exporter)

{
  ulong uVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_98;
  undefined1 local_78 [8];
  string suffix;
  undefined1 local_48 [8];
  string prefix;
  IDLExport *exporter_local;
  string *type_ns_local;
  string *ns;
  
  prefix.field_2._M_local_buf[0xf] = '\0';
  std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)type_ns);
  IDLExport::getNamespacePrefix_abi_cxx11_((string *)local_48,exporter);
  IDLExport::getNamespaceSuffix_abi_cxx11_((string *)local_78,exporter);
  uVar1 = std::__cxx11::string::empty();
  if ((uVar1 & 1) == 0) {
    std::operator+(&local_98,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_48,
                   __return_storage_ptr__);
    std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&local_98);
    std::__cxx11::string::~string((string *)&local_98);
  }
  uVar1 = std::__cxx11::string::empty();
  if ((uVar1 & 1) == 0) {
    std::__cxx11::string::operator+=((string *)__return_storage_ptr__,(string *)local_78);
  }
  prefix.field_2._M_local_buf[0xf] = '\x01';
  std::__cxx11::string::~string((string *)local_78);
  std::__cxx11::string::~string((string *)local_48);
  if ((prefix.field_2._M_local_buf[0xf] & 1U) == 0) {
    std::__cxx11::string::~string((string *)__return_storage_ptr__);
  }
  return __return_storage_ptr__;
}

Assistant:

static string getIDLAbsoluteNamespace(std::string const& type_ns, IDLExport const& exporter)
    {
        string ns = type_ns;
        string prefix = exporter.getNamespacePrefix();
        string suffix = exporter.getNamespaceSuffix();
        if (!prefix.empty())
            ns = prefix + ns;
        if (!suffix.empty())
            ns += suffix;
        return ns;
    }